

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O3

void __thiscall happly::TypedProperty<short>::~TypedProperty(TypedProperty<short> *this)

{
  ~TypedProperty(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~TypedProperty() override{}